

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

double __thiscall soinn::ESOINN::getSimilarityThreshold(ESOINN *this,Vertex *vertex)

{
  long *plVar1;
  long *plVar2;
  StoredVertexList *pSVar3;
  _List_node_base *p_Var4;
  double dVar5;
  double dVar6;
  
  plVar1 = (long *)*vertex;
  if (plVar1[2] != 0) {
    plVar2 = plVar1;
    dVar5 = 2.2250738585072014e-308;
    while (dVar6 = dVar5, plVar2 = (long *)*plVar2, plVar2 != plVar1) {
      dVar5 = distance(this,(vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)((long)*vertex + 0x20),
                       (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        *)(plVar2[2] + 0x20));
      if (dVar5 <= dVar6) {
        dVar5 = dVar6;
      }
    }
    return dVar6;
  }
  pSVar3 = &(this->graph).super_type.m_vertices;
  p_Var4 = (_List_node_base *)pSVar3;
  dVar5 = 1.79769313486232e+308;
  do {
    dVar6 = dVar5;
    do {
      p_Var4 = (((_List_base<void_*,_std::allocator<void_*>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)pSVar3) {
        return dVar6;
      }
    } while (p_Var4[1]._M_next == (_List_node_base *)*vertex);
    dVar5 = distance(this,(vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                           *)((long)*vertex + 0x20),
                     (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                      *)((long)p_Var4[1]._M_next + 0x20));
    if (dVar6 <= dVar5) {
      dVar5 = dVar6;
    }
  } while( true );
}

Assistant:

double ESOINN::getSimilarityThreshold(const Vertex& vertex)
{
    double dist = 0.0;
    if(!boost::out_degree(vertex, graph))
    {
        dist = std::numeric_limits<double>::max();
        VertexIterator current, end;
        boost::tie(current, end) = boost::vertices(graph);
        for(; current != end; current++)
        {
            if(*current != vertex)
            {
                double distCurrent = distance(graph[vertex].weight, graph[*current].weight);
                if(distCurrent < dist)
                {
                    dist = distCurrent;
                }
            }
        }
    }
    else
    {
        dist = std::numeric_limits<double>::min();
        AdjacencyIterator current, end;
        boost::tie(current, end) = boost::adjacent_vertices(vertex, graph);
        for(; current != end; current++)
        {
            double distCurrent = distance(graph[vertex].weight, graph[*current].weight);
            if(distCurrent > dist)
            {
                dist = distCurrent;
            }
        }
    }
    return dist;
}